

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O0

void mat4x4_translate_in_place(vec4 *M,float x,float y,float z)

{
  float fVar1;
  int local_4c;
  float local_48;
  int i;
  vec4 r;
  vec4 t;
  float z_local;
  float y_local;
  float x_local;
  vec4 *M_local;
  
  r[2] = x;
  r[3] = y;
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    mat4x4_row(&local_48,M,local_4c);
    fVar1 = vec4_mul_inner(&local_48,r + 2);
    M[3][local_4c] = fVar1 + M[3][local_4c];
  }
  return;
}

Assistant:

static inline void mat4x4_translate_in_place(mat4x4 M, float x, float y, float z)
{
	vec4 t = {x, y, z, 0};
	vec4 r;
	int i;
	for (i = 0; i < 4; ++i) {
		mat4x4_row(r, M, i);
		M[3][i] += vec4_mul_inner(r, t);
	}
}